

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool __thiscall
ON_RTree::Search2d(ON_RTree *this,double *a_min,double *a_max,
                  _func_bool_void_ptr_ON__INT_PTR *a_resultCallback,void *a_context)

{
  undefined1 local_78 [8];
  ON_RTreeSearchResultCallback result;
  ON_RTreeBBox rect;
  void *a_context_local;
  _func_bool_void_ptr_ON__INT_PTR *a_resultCallback_local;
  double *a_max_local;
  double *a_min_local;
  ON_RTree *this_local;
  
  if (this->m_root == (ON_RTreeNode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    result.m_resultCallback = (ON_RTreeSearchCallback)*a_min;
    local_78 = (undefined1  [8])a_context;
    result.m_context = a_resultCallback;
    this_local._7_1_ =
         SearchHelper(this->m_root,(ON_RTreeBBox *)&result.m_resultCallback,
                      (ON_RTreeSearchResultCallback *)local_78);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_RTree::Search2d(
  const double a_min[2], const double a_max[2], 
  bool ON_CALLBACK_CDECL a_resultCallback(void* a_context, ON__INT_PTR a_data),
  void* a_context
  ) const
{
  if ( 0 == m_root )
    return false;

  ON_RTreeBBox rect;
  memcpy(rect.m_min,a_min,2*sizeof(a_min[0]));
  rect.m_min[2] = 0.0;
  memcpy(rect.m_max,a_max,2*sizeof(a_max[0]));
  rect.m_max[2] = 0.0;

  ON_RTreeSearchResultCallback result;
  result.m_context = a_context;
  result.m_resultCallback = a_resultCallback;
  return SearchHelper(m_root, &rect, result);
}